

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

BinsSelectExpr *
slang::ast::BinaryBinsSelectExpr::fromSyntax(BinaryBinsSelectExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  BinsSelectExpressionSyntax *pBVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BinaryBinsSelectExpr *pBVar3;
  socklen_t __len;
  socklen_t __len_00;
  sockaddr *in_RSI;
  long in_RDI;
  Op op;
  BinsSelectExpr *right;
  BinsSelectExpr *left;
  Compilation *comp;
  Op *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  BumpAllocator *this;
  
  ASTContext::getCompilation((ASTContext *)0xfb4778);
  pBVar2 = not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::BinsSelectExpressionSyntax_*> *)0xfb478b);
  iVar1 = BinsSelectExpr::bind((int)pBVar2,in_RSI,__len);
  this = (BumpAllocator *)CONCAT44(extraout_var,iVar1);
  pBVar2 = not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::BinsSelectExpressionSyntax_*> *)0xfb47ab);
  iVar1 = BinsSelectExpr::bind((int)pBVar2,in_RSI,__len_00);
  pBVar3 = BumpAllocator::
           emplace<slang::ast::BinaryBinsSelectExpr,slang::ast::BinsSelectExpr_const&,slang::ast::BinsSelectExpr_const&,slang::ast::BinaryBinsSelectExpr::Op&>
                     (this,(BinsSelectExpr *)CONCAT44(extraout_var_00,iVar1),
                      (BinsSelectExpr *)
                      (ulong)CONCAT14(*(short *)(in_RDI + 0x20) != 0x5a,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
  return &pBVar3->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& BinaryBinsSelectExpr::fromSyntax(const BinaryBinsSelectExprSyntax& syntax,
                                                 const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& left = bind(*syntax.left, context);
    auto& right = bind(*syntax.right, context);
    Op op = syntax.op.kind == TokenKind::DoubleAnd ? And : Or;
    return *comp.emplace<BinaryBinsSelectExpr>(left, right, op);
}